

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

KeyOriginInfo *
DeserializeKeyOrigin<DataStream>
          (KeyOriginInfo *__return_storage_ptr__,DataStream *s,uint64_t length)

{
  iterator __position;
  char *pcVar1;
  size_t in_RCX;
  ulong uVar2;
  long in_FS_OFFSET;
  uint32_t index;
  uint32_t obj;
  uint local_4c;
  uint local_48 [2];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((length == 0) || ((length & 3) != 0)) {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_40 = std::iostream_category();
    local_48[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"Invalid length for HD key path");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataStream::read(s,(int)__return_storage_ptr__,(void *)0x4,in_RCX);
    if (4 < length) {
      uVar2 = 4;
      do {
        DataStream::read(s,(int)local_48,(void *)0x4,in_RCX);
        local_4c = local_48[0];
        __position._M_current =
             (__return_storage_ptr__->path).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->path).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &__return_storage_ptr__->path,__position,&local_4c);
        }
        else {
          *__position._M_current = local_48[0];
          (__return_storage_ptr__->path).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar2 = (ulong)((int)uVar2 + 4);
      } while (uVar2 < length);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

KeyOriginInfo DeserializeKeyOrigin(Stream& s, uint64_t length)
{
    // Read in key path
    if (length % 4 || length == 0) {
        throw std::ios_base::failure("Invalid length for HD key path");
    }

    KeyOriginInfo hd_keypath;
    s >> hd_keypath.fingerprint;
    for (unsigned int i = 4; i < length; i += sizeof(uint32_t)) {
        uint32_t index;
        s >> index;
        hd_keypath.path.push_back(index);
    }
    return hd_keypath;
}